

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_int_type_spec<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>>>
               (char spec,
               int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *handler
               )

{
  char in_DIL;
  int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *unaff_retaddr;
  int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *in_stack_00000020;
  int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *in_stack_00000030;
  int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *in_stack_00000050;
  
  if (in_DIL == '\0') {
LAB_002e7dcc:
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
    int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_dec
              (in_stack_00000020);
    return;
  }
  if (in_DIL == 'B') {
LAB_002e7de4:
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
    int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_bin
              (in_stack_00000020);
  }
  else {
    if (in_DIL != 'X') {
      if (in_DIL == 'b') goto LAB_002e7de4;
      if (in_DIL == 'd') goto LAB_002e7dcc;
      if (in_DIL == 'n') {
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
        ::int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_num
                  (in_stack_00000050);
        return;
      }
      if (in_DIL == 'o') {
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
        ::int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_oct
                  (in_stack_00000020);
        return;
      }
      if (in_DIL != 'x') {
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
        ::int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_error
                  (unaff_retaddr);
        return;
      }
    }
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>::
    int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_>::on_hex
              (in_stack_00000030);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}